

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodejoin.cc
# Opt level: O1

void __thiscall
QL_NodeJoin::QL_NodeJoin(QL_NodeJoin *this,QL_Manager *qlm,QL_Node *node1,QL_Node *node2)

{
  QL_Node::QL_Node(&this->super_QL_Node,qlm);
  (this->super_QL_Node)._vptr_QL_Node = (_func_int **)&PTR_OpenIt_00127a88;
  this->node1 = node1;
  this->node2 = node2;
  (this->super_QL_Node).isOpen = false;
  (this->super_QL_Node).listsInitialized = false;
  (this->super_QL_Node).attrsInRecSize = 0;
  (this->super_QL_Node).tupleLength = 0;
  (this->super_QL_Node).condIndex = 0;
  this->firstNodeSize = 0;
  this->gotFirstTuple = false;
  this->useIndexJoin = false;
  return;
}

Assistant:

QL_NodeJoin::QL_NodeJoin(QL_Manager &qlm, QL_Node &node1, QL_Node &node2) : 
  QL_Node(qlm), node1(node1), node2(node2){
  isOpen = false;
  listsInitialized = false;
  attrsInRecSize = 0;
  tupleLength = 0;
  condIndex = 0;
  firstNodeSize = 0;
  gotFirstTuple = false;
  useIndexJoin = false;
}